

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int edibility_prompts(obj *otmp)

{
  int iVar1;
  boolean bVar2;
  char cVar3;
  ushort uVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  long age;
  long rotted;
  int mnum;
  int material;
  boolean stoneorslime;
  boolean cadaver;
  char eat_it_anyway [128];
  char it_or_they [128];
  char foodsmell [256];
  char buf [256];
  obj *otmp_local;
  
  bVar7 = otmp->otyp == 0x10e;
  bVar8 = false;
  uVar4 = *(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f;
  iVar1 = otmp->corpsenm;
  age = 0;
  pcVar5 = Tobjnam(otmp,"smell");
  strcpy(it_or_they + 0x78,pcVar5);
  pcVar5 = "they";
  if (otmp->quan == 1) {
    pcVar5 = "it";
  }
  strcpy(eat_it_anyway + 0x78,pcVar5);
  pcVar5 = "one";
  if (otmp->quan == 1) {
    pcVar5 = "it";
  }
  sprintf((char *)&material,"Eat %s anyway?",pcVar5);
  if (((bVar7) || (otmp->otyp == 0x10f)) || (otmp->otyp == 0x129)) {
    if (((((long)iVar1 & 0x3ffffffffffffffU) == 0xc) ||
        (bVar8 = false, ((long)iVar1 & 0x3ffffffffffffffU) == 0xb)) &&
       ((bVar8 = false, u.uprops[8].extrinsic == 0 &&
        (bVar8 = false, (youmonst.mintrinsics & 0x80) == 0)))) {
      bVar2 = poly_when_stoned(youmonst.data);
      bVar8 = bVar2 == '\0';
    }
    if (((iVar1 == 0xd7) && (bVar8 = false, u.uprops[0x3d].intrinsic == 0)) &&
       ((bVar8 = false, u.uprops[0x3d].extrinsic == 0 &&
        ((((bVar8 = false, youmonst.data != mons + 0x73 &&
           (bVar8 = false, youmonst.data != mons + 0x20)) &&
          (bVar8 = false, youmonst.data != mons + 0xa0)) &&
         (bVar8 = false, youmonst.data != mons + 0x157)))))) {
      bVar8 = youmonst.data != mons + 0xd7;
    }
    if (((bVar7) && (iVar1 != 0x154)) && (iVar1 != 0xa3)) {
      lVar6 = peek_at_iced_corpse_age(otmp);
      age = (long)((ulong)moves - lVar6) / 10;
      if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
        if ((*(uint *)&otmp->field_0x4a >> 1 & 1) != 0) {
          age = age + -2;
        }
      }
      else {
        age = age + 2;
      }
    }
  }
  if (((bVar7) && (iVar1 != 8)) &&
     (((5 < age &&
       (((u.uprops[0x34].intrinsic == 0 && ((youmonst.data)->mlet != ' ')) &&
        (youmonst.data != mons + 0xfd)))) && (bVar2 = defends(0x21,uwep), bVar2 == '\0')))) {
    sprintf(foodsmell + 0xf8,"%s like %s could be tainted! %s",it_or_they + 0x78,
            eat_it_anyway + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (bVar8) {
    sprintf(foodsmell + 0xf8,"%s like %s could be something very dangerous! %s",it_or_they + 0x78,
            eat_it_anyway + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (((*(uint *)&otmp->field_0x4a >> 8 & 3) != 0) || ((bVar7 && (3 < age)))) {
    sprintf(foodsmell + 0xf8,"%s like %s could be rotten! %s",it_or_they + 0x78,eat_it_anyway + 0x78
            ,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (((bVar7) && ((mons[iVar1].mflags1 & 0x10000000) != 0)) &&
          (((u.uprops[6].intrinsic == 0 &&
            ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))) ||
           (((u.uprops[6].intrinsic & 0x4000000) != 0 &&
            ((((u.uprops[6].intrinsic & 0xfbffffff) == 0 && (u.uprops[6].extrinsic == 0)) &&
             ((youmonst.mintrinsics & 0x20) == 0)))))))) {
    sprintf(foodsmell + 0xf8,"%s like %s might be poisonous! %s",it_or_they + 0x78,
            eat_it_anyway + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (((((bVar7) && (mons[iVar1].mlet != '\x02')) &&
            ((mons[iVar1].mlet != '\n' &&
             ((mons[iVar1].mlet != ' ' && (mons[iVar1].mlet != '\x16')))))) &&
           (mons[iVar1].mlet != '\x19')) &&
          (((mons[iVar1].mlet != '\x1f' || (((long)iVar1 & 0x3ffffffffffffffU) == 0x9e)) &&
           ((((mons[iVar1].mlet != '7' ||
              ((((long)iVar1 & 0x3ffffffffffffffU) == 0x106 ||
               (((long)iVar1 & 0x3ffffffffffffffU) == 0x104)))) && (mons[iVar1].mlet != '6')) &&
            (((mons[iVar1].mlet != '*' || (((long)iVar1 & 0x3ffffffffffffffU) == 0xd6)) &&
             (u.roleplay.vegetarian != '\0')))))))) {
    sprintf(foodsmell + 0xf8,"%s unhealthy. %s",it_or_they + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (((bVar7) && ((mons[iVar1].mflags1 & 0x8000000) != 0)) &&
          ((u.uprops[7].extrinsic == 0 && ((youmonst.mintrinsics & 0x40) == 0)))) {
    sprintf(foodsmell + 0xf8,"%s rather acidic. %s",it_or_they + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  else if (((u.umonnum == u.umonster) || (u.umonnum != 0xd9)) ||
          (((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) < 0xb ||
           ((0x11 < (*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) ||
            ((*(uint *)&otmp->field_0x4a >> 0xc & 1) == 0)))))) {
    if ((u.roleplay.vegan == '\0') ||
       (((((uVar4 != 7 && (uVar4 != 9)) && (uVar4 != 10)) && (uVar4 != 2)) &&
        (((((!bVar7 || (mons[iVar1].mlet == '\x02')) ||
           ((mons[iVar1].mlet == '\n' || ((mons[iVar1].mlet == ' ' || (mons[iVar1].mlet == '\x16')))
            ))) || ((mons[iVar1].mlet == '\x19' ||
                    ((mons[iVar1].mlet == '\x1f' && (((long)iVar1 & 0x3ffffffffffffffU) != 0x9e)))))
          ) || (((mons[iVar1].mlet == '7' &&
                 ((((long)iVar1 & 0x3ffffffffffffffU) != 0x106 &&
                  (((long)iVar1 & 0x3ffffffffffffffU) != 0x104)))) || (mons[iVar1].mlet == '6'))))))
       )) {
      if ((u.roleplay.vegetarian == '\0') ||
         ((((uVar4 != 7 && (uVar4 != 9)) && (uVar4 != 10)) &&
          ((((((!bVar7 || (mons[iVar1].mlet == '\x02')) ||
              ((mons[iVar1].mlet == '\n' ||
               ((mons[iVar1].mlet == ' ' || (mons[iVar1].mlet == '\x16')))))) ||
             (mons[iVar1].mlet == '\x19')) ||
            ((mons[iVar1].mlet == '\x1f' && (((long)iVar1 & 0x3ffffffffffffffU) != 0x9e)))) ||
           ((((mons[iVar1].mlet == '7' &&
              ((((long)iVar1 & 0x3ffffffffffffffU) != 0x106 &&
               (((long)iVar1 & 0x3ffffffffffffffU) != 0x104)))) || (mons[iVar1].mlet == '6')) ||
            ((mons[iVar1].mlet == '*' && (((long)iVar1 & 0x3ffffffffffffffU) != 0xd6)))))))))) {
        if ((((bVar7) && (iVar1 != 8)) && (5 < age)) &&
           (((u.uprops[0x34].intrinsic != 0 || ((youmonst.data)->mlet == ' ')) ||
            ((youmonst.data == mons + 0xfd || (bVar2 = defends(0x21,uwep), bVar2 != '\0')))))) {
          sprintf(foodsmell + 0xf8,"%s like %s could be tainted! %s",it_or_they + 0x78,
                  eat_it_anyway + 0x78,&material);
          cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
          if (cVar3 == 'n') {
            otmp_local._4_4_ = 1;
          }
          else {
            otmp_local._4_4_ = 2;
          }
        }
        else {
          otmp_local._4_4_ = 0;
        }
      }
      else {
        sprintf(foodsmell + 0xf8,"%s unfamiliar to you. %s",it_or_they + 0x78,&material);
        cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
        if (cVar3 == 'n') {
          otmp_local._4_4_ = 1;
        }
        else {
          otmp_local._4_4_ = 2;
        }
      }
    }
    else {
      sprintf(foodsmell + 0xf8,"%s foul and unfamiliar to you. %s",it_or_they + 0x78,&material);
      cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
      if (cVar3 == 'n') {
        otmp_local._4_4_ = 1;
      }
      else {
        otmp_local._4_4_ = 2;
      }
    }
  }
  else {
    sprintf(foodsmell + 0xf8,"%s disgusting to you right now. %s",it_or_they + 0x78,&material);
    cVar3 = yn_function(foodsmell + 0xf8,"yn",'n');
    if (cVar3 == 'n') {
      otmp_local._4_4_ = 1;
    }
    else {
      otmp_local._4_4_ = 2;
    }
  }
  return otmp_local._4_4_;
}

Assistant:

static int edibility_prompts(struct obj *otmp)
{
	/* blessed food detection granted you a one-use
	   ability to detect food that is unfit for consumption
	   or dangerous and avoid it. */

	char buf[BUFSZ], foodsmell[BUFSZ],
	     it_or_they[QBUFSZ], eat_it_anyway[QBUFSZ];
	boolean cadaver = (otmp->otyp == CORPSE),
		stoneorslime = FALSE;
	int material = objects[otmp->otyp].oc_material,
	    mnum = otmp->corpsenm;
	long rotted = 0L;

	strcpy(foodsmell, Tobjnam(otmp, "smell"));
	strcpy(it_or_they, (otmp->quan == 1L) ? "it" : "they");
	sprintf(eat_it_anyway, "Eat %s anyway?",
		(otmp->quan == 1L) ? "it" : "one");

	if (cadaver || otmp->otyp == EGG || otmp->otyp == TIN) {
		/* These checks must match those in eatcorpse() */
		stoneorslime = (touch_petrifies(&mons[mnum]) &&
				!Stone_resistance &&
				!poly_when_stoned(youmonst.data));

		if (mnum == PM_GREEN_SLIME)
		    stoneorslime = (!Unchanging && !flaming(youmonst.data) &&
			youmonst.data != &mons[PM_GREEN_SLIME]);

		if (cadaver && mnum != PM_LIZARD && mnum != PM_LICHEN) {
			long age = peek_at_iced_corpse_age(otmp);
			/* worst case rather than random
			   in this calculation to force prompt */
			rotted = (moves - age)/(10L + 0 /* was rn2(20) */);
			if (otmp->cursed) rotted += 2L;
			else if (otmp->blessed) rotted -= 2L;
		}
	}

	/*
	 * These problems with food should be checked in
	 * order from most detrimental to least detrimental.
	 */

	if (cadaver && mnum != PM_ACID_BLOB && rotted > 5L && !Sick_resistance) {
		/* Tainted meat */
		sprintf(buf, "%s like %s could be tainted! %s",
			foodsmell, it_or_they, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (stoneorslime) {
		sprintf(buf, "%s like %s could be something very dangerous! %s",
			foodsmell, it_or_they, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (otmp->orotten || (cadaver && rotted > 3L)) {
		/* Rotten */
		sprintf(buf, "%s like %s could be rotten! %s",
			foodsmell, it_or_they, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (cadaver && poisonous(&mons[mnum]) && !FPoison_resistance) {
		/* poisonous */
		sprintf(buf, "%s like %s might be poisonous! %s",
			foodsmell, it_or_they, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (cadaver && !vegetarian(&mons[mnum]) && u.roleplay.vegetarian) {
		sprintf(buf, "%s unhealthy. %s",
			foodsmell, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (cadaver && acidic(&mons[mnum]) && !Acid_resistance) {
		sprintf(buf, "%s rather acidic. %s",
			foodsmell, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (Upolyd && u.umonnum == PM_RUST_MONSTER &&
	    is_metallic(otmp) && otmp->oerodeproof) {
		sprintf(buf, "%s disgusting to you right now. %s",
			foodsmell, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}

	/*
	 * Breaks conduct, but otherwise safe.
	 */
	 
	if (u.roleplay.vegan &&
	    ((material == LEATHER || material == BONE ||
	      material == DRAGON_HIDE || material == WAX) ||
	     (cadaver && !vegan(&mons[mnum])))) {
		sprintf(buf, "%s foul and unfamiliar to you. %s",
			foodsmell, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	if (u.roleplay.vegetarian &&
	    ((material == LEATHER || material == BONE ||
	      material == DRAGON_HIDE) ||
	     (cadaver && !vegetarian(&mons[mnum])))) {
		sprintf(buf, "%s unfamiliar to you. %s",
			foodsmell, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}

	if (cadaver && mnum != PM_ACID_BLOB && rotted > 5L && Sick_resistance) {
		/* Tainted meat with Sick_resistance */
		sprintf(buf, "%s like %s could be tainted! %s",
			foodsmell, it_or_they, eat_it_anyway);
		if (yn_function(buf,ynchars,'n')=='n') return 1;
		else return 2;
	}
	return 0;
}